

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O0

void SplitUVRow_AVX2(uint8_t *src_uv,uint8_t *dst_u,uint8_t *dst_v,int width)

{
  undefined1 (*pauVar1) [32];
  undefined1 auVar2 [32];
  bool bVar3;
  undefined1 auVar4 [32];
  int iVar5;
  long lVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 in_ZMM5 [64];
  int width_local;
  uint8_t *dst_v_local;
  uint8_t *dst_u_local;
  uint8_t *src_uv_local;
  
  auVar9 = vpcmpeqb_avx2(in_ZMM5._0_32_,in_ZMM5._0_32_);
  auVar9 = vpsrlw_avx2(auVar9,8);
  lVar6 = (long)dst_v - (long)dst_u;
  do {
    auVar2 = *(undefined1 (*) [32])src_uv;
    pauVar1 = (undefined1 (*) [32])((long)src_uv + 0x20);
    src_uv = (uint8_t *)((long)src_uv + 0x40);
    auVar7 = vpsrlw_avx2(auVar2,8);
    auVar8 = vpsrlw_avx2(*pauVar1,8);
    auVar2 = vpand_avx2(auVar2,auVar9);
    auVar4 = vpand_avx2(*pauVar1,auVar9);
    auVar2 = vpackuswb_avx2(auVar2,auVar4);
    auVar4 = vpackuswb_avx2(auVar7,auVar8);
    auVar2 = vpermq_avx2(auVar2,0xd8);
    auVar4 = vpermq_avx2(auVar4,0xd8);
    *(undefined1 (*) [32])dst_u = auVar2;
    *(undefined1 (*) [32])((long)dst_u + lVar6) = auVar4;
    dst_u = (uint8_t *)((long)dst_u + 0x20);
    iVar5 = width + -0x20;
    bVar3 = 0x1f < width;
    width = iVar5;
  } while (iVar5 != 0 && bVar3);
  return;
}

Assistant:

void SplitUVRow_AVX2(const uint8_t* src_uv,
                     uint8_t* dst_u,
                     uint8_t* dst_v,
                     int width) {
  asm volatile(
      "vpcmpeqb    %%ymm5,%%ymm5,%%ymm5          \n"
      "vpsrlw      $0x8,%%ymm5,%%ymm5            \n"
      "sub         %1,%2                         \n"

      LABELALIGN
      "1:                                        \n"
      "vmovdqu     (%0),%%ymm0                   \n"
      "vmovdqu     0x20(%0),%%ymm1               \n"
      "lea         0x40(%0),%0                   \n"
      "vpsrlw      $0x8,%%ymm0,%%ymm2            \n"
      "vpsrlw      $0x8,%%ymm1,%%ymm3            \n"
      "vpand       %%ymm5,%%ymm0,%%ymm0          \n"
      "vpand       %%ymm5,%%ymm1,%%ymm1          \n"
      "vpackuswb   %%ymm1,%%ymm0,%%ymm0          \n"
      "vpackuswb   %%ymm3,%%ymm2,%%ymm2          \n"
      "vpermq      $0xd8,%%ymm0,%%ymm0           \n"
      "vpermq      $0xd8,%%ymm2,%%ymm2           \n"
      "vmovdqu     %%ymm0,(%1)                   \n"
      "vmovdqu     %%ymm2,0x00(%1,%2,1)          \n"
      "lea         0x20(%1),%1                   \n"
      "sub         $0x20,%3                      \n"
      "jg          1b                            \n"
      "vzeroupper                                \n"
      : "+r"(src_uv),  // %0
        "+r"(dst_u),   // %1
        "+r"(dst_v),   // %2
        "+r"(width)    // %3
      :
      : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm5");
}